

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *psVar3;
  Expr *pEVar4;
  bool bVar5;
  anon_union_8_3_1bb8468b_for_uNC *paVar6;
  anon_union_8_3_1bb8468b_for_uNC aVar7;
  anon_union_8_3_1bb8468b_for_uNC *paVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Expr *pEVar12;
  long lVar13;
  ExprList_item *pEVar14;
  Expr *pE;
  Expr *pEVar15;
  ulong uVar16;
  ExprList_item *pEVar17;
  ExprList *pEVar18;
  int iVar19;
  Expr *p;
  int iCol;
  int local_b0;
  int local_ac;
  sqlite3 *local_a8;
  Parse *local_a0;
  Expr *local_98;
  ExprList *local_90;
  anon_union_8_3_1bb8468b_for_uNC *local_88;
  Parse *local_80;
  anon_union_8_3_1bb8468b_for_uNC local_78;
  ExprList_item *local_70;
  NameContext local_68;
  
  pEVar18 = pSelect->pOrderBy;
  if (pEVar18 == (ExprList *)0x0) {
    return 0;
  }
  local_a8 = pParse->db;
  uVar11 = pEVar18->nExpr;
  if (local_a8->aLimit[2] < (int)uVar11) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < (int)uVar11) {
      lVar13 = 0;
      do {
        pbVar1 = &pEVar18->a[0].field_0x19 + lVar13;
        *pbVar1 = *pbVar1 & 0xfe;
        lVar13 = lVar13 + 0x20;
      } while ((ulong)uVar11 << 5 != lVar13);
    }
    pSelect->pNext = (Select *)0x0;
    paVar8 = (anon_union_8_3_1bb8468b_for_uNC *)pSelect->pPrior;
    while (paVar6 = paVar8, paVar6 != (anon_union_8_3_1bb8468b_for_uNC *)0x0) {
      paVar6[0xb].pEList = (ExprList *)pSelect;
      pSelect = (Select *)paVar6;
      paVar8 = (anon_union_8_3_1bb8468b_for_uNC *)paVar6[10].pUpsert;
    }
    local_70 = pEVar18->a;
    iVar19 = 1;
    local_a0 = pParse;
    local_90 = pEVar18;
    do {
      if (((anon_union_8_3_1bb8468b_for_uNC *)pSelect == (anon_union_8_3_1bb8468b_for_uNC *)0x0) ||
         (iVar19 == 0)) {
        if ((long)pEVar18->nExpr < 1) {
          return 0;
        }
        uVar16 = 1;
        lVar13 = 0;
        do {
          if (((&pEVar18->a[0].field_0x19)[lVar13] & 1) == 0) {
            sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",
                            uVar16);
            return 1;
          }
          uVar16 = (ulong)((int)uVar16 + 1);
          lVar13 = lVar13 + 0x20;
        } while ((long)pEVar18->nExpr * 0x20 != lVar13);
        return 0;
      }
      local_88 = (anon_union_8_3_1bb8468b_for_uNC *)pSelect;
      if (pEVar18->nExpr < 1) {
        local_ac = 0;
      }
      else {
        local_80 = *(Parse **)pSelect;
        local_ac = 0;
        iVar19 = 0;
        pEVar17 = local_70;
        do {
          local_b0 = -1;
          if ((pEVar17->field_0x19 & 1) == 0) {
            p = pEVar17->pExpr;
            while ((p != (Expr *)0x0 && ((p->flags >> 0xc & 1) != 0))) {
              if ((p->flags >> 0x12 & 1) == 0) {
                pEVar14 = (ExprList_item *)&p->pLeft;
              }
              else {
                pEVar14 = ((p->x).pList)->a;
              }
              p = pEVar14->pExpr;
            }
            iVar9 = sqlite3ExprIsInteger(p,&local_b0);
            if (iVar9 == 0) {
              local_b0 = resolveAsName(local_80,(ExprList *)p,pE);
              if (local_b0 == 0) {
                pEVar12 = p;
                if (pParse->eParseMode < 2) {
                  if (p == (Expr *)0x0) {
                    pEVar12 = (Expr *)0x0;
                  }
                  else {
                    pEVar12 = exprDup(local_a8,p,0,(u8 **)0x0);
                  }
                }
                iVar9 = local_b0;
                if (local_a8->mallocFailed == '\0') {
                  local_78 = (anon_union_8_3_1bb8468b_for_uNC)local_88->pEList;
                  local_68.pNext = (NameContext *)0x0;
                  local_68.pWinSelect = (Select *)0x0;
                  local_68.pSrcList = (SrcList *)local_88[5].pEList;
                  local_68.ncFlags = 0x81;
                  local_68._42_6_ = 0;
                  local_68.nRef = 0;
                  local_68.nErr = 0;
                  psVar3 = pParse->db;
                  uVar2 = psVar3->suppressErr;
                  psVar3->suppressErr = '\x01';
                  local_68.pParse = pParse;
                  local_68.uNC = local_78;
                  iVar10 = sqlite3ResolveExprNames(&local_68,pEVar12);
                  aVar7 = local_78;
                  psVar3->suppressErr = uVar2;
                  pParse = local_a0;
                  iVar9 = 0;
                  if ((iVar10 == 0) && (local_98 = pEVar12, 0 < (local_78.pEList)->nExpr)) {
                    pEVar14 = (local_78.pEList)->a;
                    lVar13 = 0;
                    do {
                      uVar11 = sqlite3ExprCompare((Parse *)0x0,pEVar14->pExpr,local_98,-1);
                      pEVar12 = local_98;
                      pParse = local_a0;
                      if (uVar11 < 2) {
                        iVar9 = (int)lVar13 + 1;
                        goto LAB_0017386b;
                      }
                      lVar13 = lVar13 + 1;
                      pEVar14 = pEVar14 + 1;
                    } while (lVar13 < (aVar7.pEList)->nExpr);
                    iVar9 = 0;
                  }
                }
LAB_0017386b:
                local_b0 = iVar9;
                if ((pParse->eParseMode < 2) && (pEVar12 != (Expr *)0x0)) {
                  sqlite3ExprDeleteNN(local_a8,pEVar12);
                }
              }
            }
            else if ((local_b0 < 1) || (*(int *)&local_80->db < local_b0)) {
              bVar5 = false;
              sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                              (ulong)(iVar19 + 1),"ORDER",(ulong)*(uint *)&local_80->db);
              iVar9 = 1;
              pEVar18 = local_90;
              goto LAB_00173938;
            }
            iVar10 = local_b0;
            iVar9 = 0;
            bVar5 = true;
            if (local_b0 < 1) {
              local_ac = 1;
              pEVar18 = local_90;
              pParse = local_a0;
            }
            else {
              if (local_a0->eParseMode < 2) {
                local_68.pParse = (Parse *)0x0;
                local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
                pEVar12 = sqlite3ExprAlloc(local_a8,0x93,(Token *)&local_68,0);
                if (pEVar12 == (Expr *)0x0) {
                  iVar9 = 1;
                  bVar5 = false;
                  pEVar18 = local_90;
                  pParse = local_a0;
                  goto LAB_00173938;
                }
                pbVar1 = (byte *)((long)&pEVar12->flags + 1);
                *pbVar1 = *pbVar1 | 4;
                (pEVar12->u).iValue = iVar10;
                pEVar14 = pEVar17;
                pEVar4 = pEVar17->pExpr;
                if (pEVar17->pExpr != p) {
                  do {
                    pEVar15 = pEVar4;
                    pEVar4 = pEVar15->pLeft;
                  } while (pEVar4->op == 'j');
                  pEVar14 = (ExprList_item *)&pEVar15->pLeft;
                }
                pEVar14->pExpr = pEVar12;
                if (p != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(local_a8,p);
                }
                (pEVar17->u).x.iOrderByCol = (u16)local_b0;
              }
              pEVar17->field_0x19 = pEVar17->field_0x19 | 1;
              pEVar18 = local_90;
              pParse = local_a0;
            }
          }
          else {
            iVar9 = 0xb;
            bVar5 = false;
          }
LAB_00173938:
          if ((iVar9 != 0xb) && (pSelect = (Select *)local_88, iVar9 != 0)) goto LAB_00173970;
          iVar19 = iVar19 + 1;
          pEVar17 = pEVar17 + 1;
        } while (iVar19 < pEVar18->nExpr);
      }
      bVar5 = true;
      pSelect = (Select *)local_88[0xb].pUpsert;
LAB_00173970:
      iVar19 = local_ac;
    } while (bVar5);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          /* Now test if expression pE matches one of the values returned
          ** by pSelect. In the usual case this is done by duplicating the 
          ** expression, resolving any symbols in it, and then comparing
          ** it against each expression returned by the SELECT statement.
          ** Once the comparisons are finished, the duplicate expression
          ** is deleted.
          **
          ** Or, if this is running as part of an ALTER TABLE operation,
          ** resolve the symbols in the actual expression, not a duplicate.
          ** And, if one of the comparisons is successful, leave the expression
          ** as is instead of transforming it to an integer as in the usual
          ** case. This allows the code in alter.c to modify column
          ** refererences within the ORDER BY expression as required.  */
          if( IN_RENAME_OBJECT ){
            pDup = pE;
          }else{
            pDup = sqlite3ExprDup(db, pE, 0);
          }
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          if( !IN_RENAME_OBJECT ){
            sqlite3ExprDelete(db, pDup);
          }
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        if( !IN_RENAME_OBJECT ){
          Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
          if( pNew==0 ) return 1;
          pNew->flags |= EP_IntValue;
          pNew->u.iValue = iCol;
          if( pItem->pExpr==pE ){
            pItem->pExpr = pNew;
          }else{
            Expr *pParent = pItem->pExpr;
            assert( pParent->op==TK_COLLATE );
            while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
            assert( pParent->pLeft==pE );
            pParent->pLeft = pNew;
          }
          sqlite3ExprDelete(db, pE);
          pItem->u.x.iOrderByCol = (u16)iCol;
        }
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}